

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

char * attr_list_to_string(attr_list attrs)

{
  AttrBuffer b;
  void *pvVar1;
  long in_RDI;
  AttrBuffer tmp;
  int len;
  void *encoded;
  char *result;
  int *in_stack_ffffffffffffffc8;
  attr_list in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    b = create_AttrBuffer();
    pvVar1 = encode_attr_for_xmit(in_stack_ffffffffffffffd8,b,in_stack_ffffffffffffffc8);
    local_8 = base64_encode(in_stack_ffffffffffffffe8,(uint)((ulong)pvVar1 >> 0x20));
    free_AttrBuffer((AttrBuffer)0x106a6c);
  }
  return local_8;
}

Assistant:

extern
char *
attr_list_to_string(attr_list attrs)
{
    char * result;
    void *encoded;
    int len;
    AttrBuffer tmp;
    if (attrs == NULL) return NULL;
    tmp = create_AttrBuffer();

    encoded = encode_attr_for_xmit(attrs, tmp, &len);
    result = base64_encode(encoded, len);
    free_AttrBuffer(tmp);
    return result;
}